

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O0

PList * p_ini_file_sections(PIniFile *file)

{
  pchar *data;
  bool bVar1;
  PList *local_28;
  PList *sec;
  PList *ret;
  PIniFile *file_local;
  
  bVar1 = true;
  if (file != (PIniFile *)0x0) {
    bVar1 = file->is_parsed == 0;
  }
  if (bVar1) {
    file_local = (PIniFile *)0x0;
  }
  else {
    sec = (PList *)0x0;
    for (local_28 = file->sections; local_28 != (PList *)0x0; local_28 = local_28->next) {
      data = p_strdup(*local_28->data);
      sec = p_list_prepend(sec,data);
    }
    file_local = (PIniFile *)sec;
  }
  return (PList *)file_local;
}

Assistant:

P_LIB_API PList *
p_ini_file_sections (const PIniFile *file)
{
	PList	*ret;
	PList	*sec;

	if (P_UNLIKELY (file == NULL || file->is_parsed == FALSE))
		return NULL;

	ret = NULL;

	for (sec = file->sections; sec != NULL; sec = sec->next)
		ret = p_list_prepend (ret, p_strdup (((PIniSection *) sec->data)->name));

	return ret;
}